

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O0

RK_S32 mpp_hevc_frame_nb_refs(HEVCContext *s)

{
  ShortTermRPS *pSVar1;
  LongTermRPS *long_rps;
  ShortTermRPS *rps;
  RK_S32 i;
  RK_S32 ret;
  HEVCContext *s_local;
  
  rps._4_4_ = 0;
  pSVar1 = (s->sh).short_term_rps;
  if ((s->sh).slice_type == I_SLICE) {
    s_local._4_4_ = 0;
  }
  else {
    if (pSVar1 != (ShortTermRPS *)0x0) {
      for (rps._0_4_ = 0; (uint)rps < pSVar1->num_negative_pics; rps._0_4_ = (uint)rps + 1) {
        rps._4_4_ = (uint)(pSVar1->used[(int)(uint)rps] != '\0') + rps._4_4_;
      }
      for (; (int)(uint)rps < pSVar1->num_delta_pocs; rps._0_4_ = (uint)rps + 1) {
        rps._4_4_ = (uint)(pSVar1->used[(int)(uint)rps] != '\0') + rps._4_4_;
      }
    }
    if (s != (HEVCContext *)0xfffffffffffffbe8) {
      for (rps._0_4_ = 0; (int)(uint)rps < (int)(uint)(s->sh).long_term_rps.nb_refs;
          rps._0_4_ = (uint)rps + 1) {
        rps._4_4_ = (uint)((s->sh).long_term_rps.used[(int)(uint)rps] != '\0') + rps._4_4_;
      }
    }
    s_local._4_4_ = rps._4_4_;
  }
  return s_local._4_4_;
}

Assistant:

int mpp_hevc_frame_nb_refs(HEVCContext *s)
{
    RK_S32 ret = 0;
    RK_S32 i;
    const ShortTermRPS *rps = s->sh.short_term_rps;
    LongTermRPS *long_rps   = &s->sh.long_term_rps;

    if (s->sh.slice_type == I_SLICE) {
        return 0;
    }
    if (rps) {
        for (i = 0; (RK_U32)i < rps->num_negative_pics; i++)
            ret += !!rps->used[i];
        for (; i < rps->num_delta_pocs; i++)
            ret += !!rps->used[i];
    }

    if (long_rps) {
        for (i = 0; i < long_rps->nb_refs; i++)
            ret += !!long_rps->used[i];
    }
    return ret;
}